

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O0

void dg::vr::RelationsAnalyzer::relateValues
               (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                *changeLocations,VectorSet<const_llvm::Value_*> *froms,ValueRelations *newGraph,
               Handle placeholder)

{
  bool bVar1;
  const_reference ppVVar2;
  reference ppVar3;
  Bucket *lt;
  const_iterator rels;
  const_iterator this;
  reference ppVVar4;
  _Base_bitset<1UL> _Var5;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *in_RDI;
  HandlePtr borderH;
  Relations common_1;
  size_t mBorderId;
  Relations common;
  V related;
  const_iterator __end3;
  const_iterator __begin3;
  VectorSet<const_llvm::Value_*> *__range3;
  Relations relations;
  Handle relatedH;
  pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations> pair;
  iterator __end2;
  iterator __begin2;
  RelationsMap *__range2;
  Handle pointedTo;
  HandlePtr from;
  ValueRelations *predGraph;
  Bucket *in_stack_fffffffffffffef8;
  _Base_bitset<1UL> in_stack_ffffffffffffff00;
  HandlePtr in_stack_ffffffffffffff08;
  ValueRelations *in_stack_ffffffffffffff10;
  ValueRelations *froms_00;
  Relations *in_stack_ffffffffffffff18;
  Bucket *in_stack_ffffffffffffff20;
  _Base_bitset<1UL> in_stack_ffffffffffffff28;
  ValueRelations *in_stack_ffffffffffffff30;
  _Base_bitset<1UL> in_stack_ffffffffffffff38;
  Bucket *in_stack_ffffffffffffff40;
  _Self local_80;
  _Self local_78;
  undefined1 local_70 [48];
  undefined1 *local_40;
  Handle local_38;
  HandlePtr local_30;
  ValueRelations *local_28;
  
  ppVVar2 = std::vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::
            operator[](in_RDI,0);
  local_28 = &(*ppVVar2)->relations;
  local_30 = getCorrespondingByContent
                       ((ValueRelations *)in_stack_ffffffffffffff28._M_w,
                        (VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff20);
  local_38 = ValueRelations::getPointedTo<dg::vr::Bucket>
                       ((ValueRelations *)in_stack_ffffffffffffff00._M_w,in_stack_fffffffffffffef8);
  ValueRelations::getRelated<dg::vr::Bucket>
            ((ValueRelations *)in_stack_ffffffffffffff28._M_w,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  local_40 = local_70;
  local_78._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::begin((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
                *)in_stack_fffffffffffffef8);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
       ::end((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
              *)in_stack_fffffffffffffef8);
  do {
    bVar1 = std::operator!=(&local_78,&local_80);
    if (!bVar1) {
      std::
      map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
      ::~map((map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
              *)0x1d1ce5);
      return;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
             ::operator*((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                          *)0x1d1cf7);
    froms_00 = (ValueRelations *)(ppVar3->second).bits.super__Base_bitset<1UL>._M_w;
    lt = std::reference_wrapper::operator_cast_to_Bucket_
                   ((reference_wrapper<const_dg::vr::Bucket> *)0x1d1d15);
    bVar1 = vr::operator==(lt,local_38);
    if (bVar1) {
      ValueRelations::getEqual(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar1 = VectorSet<const_llvm::Value_*>::empty((VectorSet<const_llvm::Value_*> *)0x1d1d59);
      if (bVar1) goto LAB_001d1d62;
    }
    else {
LAB_001d1d62:
      ValueRelations::getEqual(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      rels = VectorSet<const_llvm::Value_*>::begin
                       ((VectorSet<const_llvm::Value_*> *)in_stack_fffffffffffffef8);
      this = VectorSet<const_llvm::Value_*>::end
                       ((VectorSet<const_llvm::Value_*> *)in_stack_fffffffffffffef8);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)in_stack_ffffffffffffff00._M_w,
                                (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                                 *)in_stack_fffffffffffffef8), bVar1) {
        ppVVar4 = __gnu_cxx::
                  __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                  ::operator*((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                               *)&stack0xffffffffffffff50);
        in_stack_ffffffffffffff40 = (Bucket *)*ppVVar4;
        in_stack_ffffffffffffff30 = froms_00;
        in_stack_ffffffffffffff38._M_w =
             (_WordT)getCommonByPointedTo<llvm::Value_const*>
                               ((VectorSet<const_llvm::Value_*> *)froms_00,
                                in_stack_ffffffffffffff28._M_w,(Value **)in_stack_ffffffffffffff20,
                                in_stack_ffffffffffffff38._M_w);
        bVar1 = Relations::any((Relations *)0x1d1df9);
        if (bVar1) {
          _Var5._M_w = in_stack_ffffffffffffff38._M_w;
          ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
                    ((ValueRelations *)this._M_current,in_stack_ffffffffffffff40,
                     (Relations)rels._M_current,(Value **)in_stack_ffffffffffffff38._M_w);
          in_stack_ffffffffffffff28._M_w = in_stack_ffffffffffffff38._M_w;
          in_stack_ffffffffffffff38._M_w = _Var5._M_w;
        }
        __gnu_cxx::
        __normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
        ::operator++((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                      *)&stack0xffffffffffffff50);
      }
      in_stack_ffffffffffffff20 =
           (Bucket *)
           ValueRelations::getBorderId
                     ((ValueRelations *)in_stack_ffffffffffffff00._M_w,in_stack_fffffffffffffef8);
      if (in_stack_ffffffffffffff20 != (Bucket *)0xffffffffffffffff) {
        _Var5._M_w = (_WordT)getCommonByPointedTo<unsigned_long>
                                       ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffff30,
                                        in_stack_ffffffffffffff28._M_w,
                                        (unsigned_long *)in_stack_ffffffffffffff20,
                                        in_stack_ffffffffffffff38._M_w);
        bVar1 = Relations::any((Relations *)0x1d1e94);
        in_stack_ffffffffffffff10 = froms_00;
        if (bVar1) {
          in_stack_ffffffffffffff08 =
               ValueRelations::getBorderH
                         ((ValueRelations *)in_stack_ffffffffffffff00._M_w,
                          (size_t)in_stack_fffffffffffffef8);
          in_stack_ffffffffffffff00._M_w = _Var5._M_w;
          if (in_stack_ffffffffffffff08 == (HandlePtr)0x0) {
            in_stack_ffffffffffffff08 =
                 ValueRelations::newBorderBucket
                           ((ValueRelations *)in_stack_ffffffffffffff20,_Var5._M_w);
            in_stack_ffffffffffffff00._M_w = _Var5._M_w;
          }
          ValueRelations::set<dg::vr::Bucket,dg::vr::Bucket>
                    ((ValueRelations *)this._M_current,in_stack_ffffffffffffff40,
                     (Relations)rels._M_current,(Bucket *)in_stack_ffffffffffffff38._M_w);
          in_stack_ffffffffffffff10 = froms_00;
        }
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)in_stack_ffffffffffffff00._M_w);
  } while( true );
}

Assistant:

void RelationsAnalyzer::relateValues(
        const std::vector<const VRLocation *> &changeLocations,
        const VectorSet<V> &froms, ValueRelations &newGraph,
        Handle placeholder) {
    const ValueRelations &predGraph = changeLocations[0]->relations;
    HandlePtr from = getCorrespondingByContent(predGraph, froms);
    assert(from);
    Handle pointedTo = predGraph.getPointedTo(*from);

    for (auto pair : predGraph.getRelated(pointedTo, comparative)) {
        Handle relatedH = pair.first;
        Relations relations = pair.second;

        assert(predGraph.are(pointedTo, relations, relatedH));

        if (relatedH == pointedTo && !predGraph.getEqual(relatedH).empty())
            continue;

        for (V related : predGraph.getEqual(relatedH)) {
            Relations common = getCommonByPointedTo(froms, changeLocations,
                                                    related, relations);
            if (common.any())
                newGraph.set(placeholder, common, related);
        }

        size_t mBorderId = predGraph.getBorderId(relatedH);
        if (mBorderId != std::string::npos) {
            Relations common = getCommonByPointedTo(froms, changeLocations,
                                                    mBorderId, relations);

            if (common.any()) {
                auto borderH = newGraph.getBorderH(mBorderId);
                if (!borderH)
                    borderH = &newGraph.newBorderBucket(mBorderId);
                newGraph.set(placeholder, common, *borderH);
            }
        }
    }
}